

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O1

void WebPInitAlphaProcessing(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)
                             &WebPInitAlphaProcessing::WebPInitAlphaProcessing_body_lock);
  if (iVar1 != 0) {
    return;
  }
  if (WebPInitAlphaProcessing::WebPInitAlphaProcessing_body_last_cpuinfo_used != VP8GetCPUInfo) {
    WebPMultARGBRow = WebPMultARGBRow_C;
    WebPMultRow = WebPMultRow_C;
    WebPApplyAlphaMultiply4444 = ApplyAlphaMultiply_16b_C;
    WebPPackRGB = PackRGB_C;
    WebPApplyAlphaMultiply = ApplyAlphaMultiply_C;
    WebPDispatchAlpha = DispatchAlpha_C;
    WebPDispatchAlphaToGreen = DispatchAlphaToGreen_C;
    WebPExtractAlpha = ExtractAlpha_C;
    WebPExtractGreen = ExtractGreen_C;
    WebPHasAlpha8b = HasAlpha8b_C;
    WebPHasAlpha32b = HasAlpha32b_C;
    WebPAlphaReplace = AlphaReplace_C;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar1 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar1 != 0) {
        WebPInitAlphaProcessingSSE2();
        iVar1 = (*VP8GetCPUInfo)(kSSE4_1);
        if (iVar1 != 0) {
          WebPInitAlphaProcessingSSE41();
        }
      }
    }
  }
  WebPInitAlphaProcessing::WebPInitAlphaProcessing_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock
            ((pthread_mutex_t *)&WebPInitAlphaProcessing::WebPInitAlphaProcessing_body_lock);
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(WebPInitAlphaProcessing) {
  WebPMultARGBRow = WebPMultARGBRow_C;
  WebPMultRow = WebPMultRow_C;
  WebPApplyAlphaMultiply4444 = ApplyAlphaMultiply_16b_C;

#ifdef WORDS_BIGENDIAN
  WebPPackARGB = PackARGB_C;
#endif
  WebPPackRGB = PackRGB_C;
#if !WEBP_NEON_OMIT_C_CODE
  WebPApplyAlphaMultiply = ApplyAlphaMultiply_C;
  WebPDispatchAlpha = DispatchAlpha_C;
  WebPDispatchAlphaToGreen = DispatchAlphaToGreen_C;
  WebPExtractAlpha = ExtractAlpha_C;
  WebPExtractGreen = ExtractGreen_C;
#endif

  WebPHasAlpha8b = HasAlpha8b_C;
  WebPHasAlpha32b = HasAlpha32b_C;
  WebPAlphaReplace = AlphaReplace_C;

  // If defined, use CPUInfo() to overwrite some pointers with faster versions.
  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      WebPInitAlphaProcessingSSE2();
#if defined(WEBP_HAVE_SSE41)
      if (VP8GetCPUInfo(kSSE4_1)) {
        WebPInitAlphaProcessingSSE41();
      }
#endif
    }
#endif
#if defined(WEBP_USE_MIPS_DSP_R2)
    if (VP8GetCPUInfo(kMIPSdspR2)) {
      WebPInitAlphaProcessingMIPSdspR2();
    }
#endif
  }

#if defined(WEBP_HAVE_NEON)
  if (WEBP_NEON_OMIT_C_CODE ||
      (VP8GetCPUInfo != NULL && VP8GetCPUInfo(kNEON))) {
    WebPInitAlphaProcessingNEON();
  }
#endif

  assert(WebPMultARGBRow != NULL);
  assert(WebPMultRow != NULL);
  assert(WebPApplyAlphaMultiply != NULL);
  assert(WebPApplyAlphaMultiply4444 != NULL);
  assert(WebPDispatchAlpha != NULL);
  assert(WebPDispatchAlphaToGreen != NULL);
  assert(WebPExtractAlpha != NULL);
  assert(WebPExtractGreen != NULL);
#ifdef WORDS_BIGENDIAN
  assert(WebPPackARGB != NULL);
#endif
  assert(WebPPackRGB != NULL);
  assert(WebPHasAlpha8b != NULL);
  assert(WebPHasAlpha32b != NULL);
  assert(WebPAlphaReplace != NULL);
}